

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_buffer.cc
# Opt level: O0

int bssl::ssl_read_buffer_extend_to(SSL *ssl,size_t len)

{
  bool bVar1;
  int iVar2;
  int local_24;
  size_t sStack_20;
  int ret;
  size_t len_local;
  SSL *ssl_local;
  
  SSLBuffer::DiscardConsumed(&ssl->s3->read_buffer);
  iVar2 = SSL_is_dtls(ssl);
  sStack_20 = len;
  if (iVar2 != 0) {
    sStack_20 = 0x414d;
  }
  bVar1 = SSLBuffer::EnsureCap(&ssl->s3->read_buffer,0xd,sStack_20);
  if (bVar1) {
    bVar1 = std::operator==(&ssl->rbio,(nullptr_t)0x0);
    if (bVar1) {
      ERR_put_error(0x10,0,0x77,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_buffer.cc"
                    ,0xb9);
      ssl_local._4_4_ = -1;
    }
    else {
      iVar2 = SSL_is_dtls(ssl);
      if (iVar2 == 0) {
        local_24 = tls_read_buffer_extend_to(ssl,sStack_20);
      }
      else {
        local_24 = dtls_read_buffer_next_packet(ssl);
      }
      if (local_24 < 1) {
        SSLBuffer::DiscardConsumed(&ssl->s3->read_buffer);
      }
      ssl_local._4_4_ = local_24;
    }
  }
  else {
    ssl_local._4_4_ = -1;
  }
  return ssl_local._4_4_;
}

Assistant:

int ssl_read_buffer_extend_to(SSL *ssl, size_t len) {
  // |ssl_read_buffer_extend_to| implicitly discards any consumed data.
  ssl->s3->read_buffer.DiscardConsumed();

  if (SSL_is_dtls(ssl)) {
    static_assert(
        DTLS1_RT_MAX_HEADER_LENGTH + SSL3_RT_MAX_ENCRYPTED_LENGTH <= 0xffff,
        "DTLS read buffer is too large");

    // The |len| parameter is ignored in DTLS.
    len = DTLS1_RT_MAX_HEADER_LENGTH + SSL3_RT_MAX_ENCRYPTED_LENGTH;
  }

  // The DTLS record header can have a variable length, so the |header_len|
  // value provided for buffer alignment only works if the header is the maximum
  // length.
  if (!ssl->s3->read_buffer.EnsureCap(DTLS1_RT_MAX_HEADER_LENGTH, len)) {
    return -1;
  }

  if (ssl->rbio == nullptr) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_BIO_NOT_SET);
    return -1;
  }

  int ret;
  if (SSL_is_dtls(ssl)) {
    // |len| is ignored for a datagram transport.
    ret = dtls_read_buffer_next_packet(ssl);
  } else {
    ret = tls_read_buffer_extend_to(ssl, len);
  }

  if (ret <= 0) {
    // If the buffer was empty originally and remained empty after attempting to
    // extend it, release the buffer until the next attempt.
    ssl->s3->read_buffer.DiscardConsumed();
  }
  return ret;
}